

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testReader.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  FILE *__stream;
  int testdata;
  undefined1 local_14 [4];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Input file:");
  poVar1 = std::operator<<(poVar1,"input1.lef");
  std::endl<char,std::char_traits<char>>(poVar1);
  __stream = fopen("input1.lef","r");
  LefDefParser::lefrSetMacroCbk(test);
  LefDefParser::lefrSetPinCbk(PinCBK);
  LefDefParser::lefrRead(__stream,"input1.lef",local_14);
  fclose(__stream);
  return 0;
}

Assistant:

int main(){
    const char *Filename = "input1.lef";
    std::cout << "Input file:" << Filename << std::endl;
    FILE *fin = fopen(Filename, "r");
    int testdata;
    lefrSetMacroCbk(test);
    lefrSetPinCbk(PinCBK);
    lefrRead(fin, Filename, &testdata);
    fclose(fin);
}